

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O1

void test_base_swaps<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true>>>
               (void)

{
  template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
  *this;
  uint uVar1;
  uint uVar2;
  pointer ppVar3;
  pointer ppVar4;
  pointer ppVar5;
  pointer ppVar6;
  pointer puVar7;
  Column_settings *pCVar8;
  Column_settings *pCVar9;
  Column_zp_settings *this_00;
  ulong uVar10;
  undefined8 uVar11;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  columns;
  Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>
  m;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  local_1a8;
  uint local_190 [6];
  Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>
  local_178;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true>>>>
            ();
  this_00 = (Column_zp_settings *)operator_new(0x58);
  Gudhi::persistence_matrix::
  Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>
  ::Column_zp_settings::Column_zp_settings(this_00,5);
  local_178.colSettings_ = this_00;
  Gudhi::persistence_matrix::
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true>>>
  ::
  Boundary_matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true>>>
              *)&local_178.matrix_,&local_1a8,this_00);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true>>>
            (&local_1a8,&local_178);
  uVar10 = ((long)local_178.matrix_.matrix_.
                  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_178.matrix_.matrix_.
                  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  if (uVar10 < 4) {
    uVar11 = 3;
  }
  else {
    uVar11 = 5;
    if (5 < uVar10) {
      Gudhi::persistence_matrix::swap
                (local_178.matrix_.matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 3,
                 local_178.matrix_.matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 5);
      local_178.matrix_.
      super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
      .rowSwapped_ = true;
      if (5 < (ulong)(((long)local_178.matrix_.matrix_.
                             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_178.matrix_.matrix_.
                             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7))
      {
        Gudhi::persistence_matrix::swap
                  (local_178.matrix_.matrix_.
                   super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 5,
                   local_178.matrix_.matrix_.
                   super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1);
        local_178.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
        .rowSwapped_ = true;
        ppVar3 = local_1a8.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[3].
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ppVar4 = local_1a8.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[3].
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        ppVar5 = local_1a8.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[3].
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_1a8.
        super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[3].
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_1a8.
             super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[5].
             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_1a8.
        super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[3].
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_1a8.
             super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[5].
             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_1a8.
        super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[3].
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_1a8.
             super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[5].
             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        ppVar6 = local_1a8.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1].
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_1a8.
        super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[5].
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_1a8.
             super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_1a8.
        super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[5].
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppVar6;
        local_1a8.
        super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[5].
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_1a8.
             super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_1a8.
        super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1].
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start = ppVar3;
        local_1a8.
        super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1].
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppVar4;
        local_1a8.
        super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1].
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar5;
        test_content_equality<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true>>>
                  (&local_1a8,&local_178);
        this = &local_178.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
        ;
        local_178.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
        .rowSwapped_ = true;
        uVar10 = (long)local_178.matrix_.
                       super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
                       .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_178.matrix_.
                       super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
                       .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2;
        if (uVar10 < 6) {
          do {
            local_190[0] = (uint)uVar10;
            if (local_178.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
                .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_finish ==
                local_178.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
                .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&this->indexToRow_,
                         (iterator)
                         local_178.matrix_.
                         super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
                         .indexToRow_.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish,local_190);
            }
            else {
              *local_178.matrix_.
               super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
               .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_190[0];
              local_178.matrix_.
              super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
              .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_178.matrix_.
                   super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
                   .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 != 6);
        }
        uVar1 = local_178.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
                .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start[5];
        uVar2 = local_178.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
                .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start
                [local_178.matrix_.
                 super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
                 .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[3]];
        local_178.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
        .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start
        [local_178.matrix_.
         super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
         .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start[3]] =
             local_178.matrix_.
             super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
             .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar1];
        local_178.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
        .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar1] = uVar2;
        uVar1 = local_178.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
                .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start[3];
        local_178.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
        .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[3] =
             local_178.matrix_.
             super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
             .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[5];
        local_178.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
        .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[5] = uVar1;
        local_178.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
        .rowSwapped_ = true;
        uVar10 = (long)local_178.matrix_.
                       super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
                       .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_178.matrix_.
                       super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
                       .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2;
        if (uVar10 < 6) {
          do {
            local_190[0] = (uint)uVar10;
            if (local_178.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
                .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_finish ==
                local_178.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
                .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&this->indexToRow_,
                         (iterator)
                         local_178.matrix_.
                         super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
                         .indexToRow_.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish,local_190);
            }
            else {
              *local_178.matrix_.
               super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
               .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_190[0];
              local_178.matrix_.
              super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
              .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_178.matrix_.
                   super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
                   .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 != 6);
        }
        uVar1 = local_178.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
                .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start[1];
        uVar2 = local_178.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
                .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start
                [local_178.matrix_.
                 super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
                 .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[5]];
        local_178.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
        .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start
        [local_178.matrix_.
         super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
         .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start[5]] =
             local_178.matrix_.
             super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
             .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar1];
        local_178.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
        .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar1] = uVar2;
        uVar1 = local_178.matrix_.
                super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
                .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start[5];
        local_178.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
        .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[5] =
             local_178.matrix_.
             super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
             .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[1];
        local_178.matrix_.
        super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_false,_false,_true,_true>_>_>_>
        .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[1] = uVar1;
        local_190[0] = 2;
        local_190[1] = 4;
        local_190[2] = 5;
        local_190[3] = 1;
        std::
        vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
        ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
                  ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                    *)(local_1a8.
                       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 4),local_190);
        local_190[0] = 1;
        local_190[1] = 1;
        local_190[2] = 3;
        local_190[3] = 4;
        local_190[4] = 4;
        local_190[5] = 1;
        std::
        vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
        ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
                  ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                    *)(local_1a8.
                       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 6),local_190);
        local_190[0] = 0;
        local_190[1] = 1;
        local_190[2] = 5;
        local_190[3] = 4;
        std::
        vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
        ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
                  ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                    *)(local_1a8.
                       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1),local_190);
        test_content_equality<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true>>>
                  (&local_1a8,&local_178);
        pCVar8 = local_178.colSettings_;
        std::
        vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>_>_>
        ::_M_erase_at_end(&local_178.matrix_.matrix_,
                          local_178.matrix_.matrix_.
                          super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        pCVar9 = local_178.colSettings_;
        local_178.matrix_.nextInsertIndex_ = 0;
        local_178.matrix_.colSettings_ = pCVar8;
        if (local_178.colSettings_ != (Column_zp_settings *)0x0) {
          boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
                    ((pool<boost::default_user_allocator_malloc_free> *)
                     &(local_178.colSettings_)->entryConstructor);
          puVar7 = (pCVar9->operators).inverse_.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (puVar7 != (pointer)0x0) {
            operator_delete(puVar7,(long)(pCVar9->operators).inverse_.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)puVar7);
          }
          operator_delete(pCVar9,0x58);
        }
        Gudhi::persistence_matrix::
        Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>
        ::~Boundary_matrix(&local_178.matrix_);
        std::
        vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
        ::~vector(&local_1a8);
        return;
      }
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar11);
}

Assistant:

void test_base_swaps() {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  test_content_equality(columns, m);

  m.swap_columns(3, 5);
  if constexpr (Matrix::Option_list::column_indexation_type == Column_indexation_types::IDENTIFIER) {
    m.swap_columns(3, 1);
  } else {
    m.swap_columns(5, 1);
    columns[3].swap(columns[5]);
    columns[5].swap(columns[1]);
  }

  test_content_equality(columns, m);

  m.swap_rows(3, 5);
  m.swap_rows(5, 1);

  if constexpr (Matrix::Option_list::is_z2) {
    columns[4] = {2, 5};
    columns[6] = {1, 3, 4};
    if constexpr (Matrix::Option_list::column_indexation_type == Column_indexation_types::IDENTIFIER) {
      columns[3] = {0, 5};
      columns[5] = {0, 2};
    } else {
      columns[1] = {0, 5};
    }
  } else {
    columns[4] = {{2, 4}, {5, 1}};
    columns[6] = {{1, 1}, {3, 4}, {4, 1}};
    if constexpr (Matrix::Option_list::column_indexation_type == Column_indexation_types::IDENTIFIER) {
      columns[3] = {{0, 1}, {5, 4}};
      columns[5] = {{0, 1}, {2, 4}};
    } else {
      columns[1] = {{0, 1}, {5, 4}};
    }
  }

  test_content_equality(columns, m);
}